

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::FlushLogFilesUnsafe(LogSeverity min_severity)

{
  difference_type __d;
  anon_class_8_1_ba1d6636 __f;
  
  __f.now.__d.__r = (time_point)std::chrono::_V2::system_clock::now();
  std::
  for_each<std::unique_ptr<google::LogDestination,std::default_delete<google::LogDestination>>*,google::LogDestination::FlushLogFilesUnsafe(int)::_lambda(std::unique_ptr<google::LogDestination,std::default_delete<google::LogDestination>>&)_1_>
            ((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
             (&LogDestination::log_destinations_ + (int)min_severity),
             (unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
             &(anonymous_namespace)::g_application_fingerprint_abi_cxx11_,__f);
  return;
}

Assistant:

inline void LogDestination::FlushLogFilesUnsafe(int min_severity) {
  // assume we have the log_mutex or we simply don't care
  // about it
  std::for_each(std::next(std::begin(log_destinations_), min_severity),
                std::end(log_destinations_),
                [now = std::chrono::system_clock::now()](
                    std::unique_ptr<LogDestination>& log) {
                  if (log != nullptr) {
                    // Flush the base fileobject_ logger directly instead of
                    // going through any wrappers to reduce chance of deadlock.
                    log->fileobject_.FlushUnlocked(now);
                  }
                });
}